

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void test_qpixl_frqi_util_convert_angles_grayscale<float>(void)

{
  pointer *__ptr;
  char *pcVar1;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  AssertionResult gtest_ar;
  vector<float,_std::allocator<float>_> a;
  vector<float,_std::allocator<float>_> a_c;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff98;
  AssertHelper local_60;
  char local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  double val2;
  double val1;
  float *in_stack_ffffffffffffffc8;
  float *pfVar2;
  float *local_30;
  pointer local_28;
  vector<float,_std::allocator<float>_> local_20;
  
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = -0x80;
  local_58[3] = '?';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '@';
  __l._M_len = 8;
  __l._M_array = (iterator)local_58;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&stack0xffffffffffffffc8,__l,
             (allocator_type *)&local_20);
  val2 = 8192.001972198486;
  val1 = 131072.0316772461;
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = -0x80;
  local_58[3] = '?';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '@';
  __ptr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4080000040400000
  ;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)local_58;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_20,__l_00,(allocator_type *)&stack0xffffffffffffff98);
  for (pfVar2 = in_stack_ffffffffffffffc8; pfVar2 != local_30; pfVar2 = pfVar2 + 1) {
    *pfVar2 = *pfVar2 * 0.006159986;
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x1199f5,
             (char *)in_stack_ffffffffffffffc8,val1,val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x113,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x119ab9,
             (char *)in_stack_ffffffffffffffc8,val1,val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x114,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x119b7d,
             (char *)in_stack_ffffffffffffffc8,val1,val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x115,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x119c41,
             (char *)in_stack_ffffffffffffffc8,val1,val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x116,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x119d05,
             (char *)in_stack_ffffffffffffffc8,val1,val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x117,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x119dc9,
             (char *)in_stack_ffffffffffffffc8,val1,val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x118,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x119e8d,
             (char *)in_stack_ffffffffffffffc8,val1,val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x119,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x119f51,
             (char *)in_stack_ffffffffffffffc8,val1,val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x11a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  pfVar2 = in_stack_ffffffffffffffc8;
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
    pfVar2 = in_stack_ffffffffffffffc8;
  }
  for (; in_stack_ffffffffffffffc8 != local_30;
      in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1) {
    *in_stack_ffffffffffffffc8 = *in_stack_ffffffffffffffc8 * 162.33804;
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x11a034,(char *)pfVar2,val1,
             val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x11d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x11a0ef,(char *)pfVar2,val1,
             val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x11e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x11a1aa,(char *)pfVar2,val1,
             val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x11f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x11a265,(char *)pfVar2,val1,
             val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x120,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x11a320,(char *)pfVar2,val1,
             val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x121,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x11a3db,(char *)pfVar2,val1,
             val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x122,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x11a496,(char *)pfVar2,val1,
             val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x123,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff98._M_head_impl,(char *)0x11a551,(char *)pfVar2,val1,
             val2,(double)__ptr_00);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (__ptr_00->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x124,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98._M_head_impl + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffb0,__ptr_00);
  }
  if (local_20.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pfVar2 != (float *)0x0) {
    operator_delete(pfVar2,(long)local_28 - (long)pfVar2);
  }
  return;
}

Assistant:

void test_qpixl_frqi_util_convert_angles_grayscale() {
  std::vector< R > a = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 } ;
  std::vector< R > a_c = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 } ;
  size_t maxval = 255 ;

  const R eps = std::numeric_limits< R >::epsilon() ;
  const R pi2 = 2 * std::atan(1) ;
  const R scal = pi2 / maxval ;

  qpixl::frqi::convertToAngles( a , maxval ) ;
  EXPECT_NEAR( a[ 0] , a_c[ 0]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 1] , a_c[ 1]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 2] , a_c[ 2]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 3] , a_c[ 3]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 4] , a_c[ 4]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 5] , a_c[ 5]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 6] , a_c[ 6]*scal  , 10*eps ) ;
  EXPECT_NEAR( a[ 7] , a_c[ 7]*scal  , 10*eps ) ;
  
  qpixl::frqi::convertToGrayscale( a , maxval ) ;
  EXPECT_NEAR( a[ 0] , a_c[ 0]  , 10*eps ) ;
  EXPECT_NEAR( a[ 1] , a_c[ 1]  , 10*eps ) ;
  EXPECT_NEAR( a[ 2] , a_c[ 2]  , 10*eps ) ;
  EXPECT_NEAR( a[ 3] , a_c[ 3]  , 10*eps ) ;
  EXPECT_NEAR( a[ 4] , a_c[ 4]  , 10*eps ) ;
  EXPECT_NEAR( a[ 5] , a_c[ 5]  , 10*eps ) ;
  EXPECT_NEAR( a[ 6] , a_c[ 6]  , 10*eps ) ;
  EXPECT_NEAR( a[ 7] , a_c[ 7]  , 10*eps ) ;

}